

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolor.cpp
# Opt level: O1

void __thiscall QColor::setHsl(QColor *this,int h,int s,int l,int a)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  
  if ((-2 < h) && ((uint)(l | s | a) < 0x100)) {
    this->cspec = Hsl;
    (this->ct).argb.alpha = (short)(a << 8) + (short)a;
    if (h == -1) {
      uVar1 = 0xffff;
    }
    else {
      uVar1 = ((short)h + (short)((uint)h / 0x168) * -0x168) * 100;
    }
    (this->ct).argb.red = uVar1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (ulong)(uint)s & 0xffffffff0000ffff | (ulong)(ushort)l << 0x10;
    auVar2 = psllw(auVar2,8);
    *(uint *)((long)&this->ct + 4) =
         CONCAT22(auVar2._2_2_ + (ushort)l,
                  auVar2._0_2_ + (short)((ulong)(uint)s & 0xffffffff0000ffff));
    (this->ct).argb.pad = 0;
    return;
  }
  setHsl(this);
  return;
}

Assistant:

void QColor::setHsl(int h, int s, int l, int a)
{
    if (h < -1 || (uint)s > 255 || (uint)l > 255 || (uint)a > 255) {
        qWarning("QColor::setHsl: HSL parameters out of range");
        invalidate();
        return;
    }

    cspec = Hsl;
    ct.ahsl.alpha      = a * 0x101;
    ct.ahsl.hue        = h == -1 ? USHRT_MAX : (h % 360) * 100;
    ct.ahsl.saturation = s * 0x101;
    ct.ahsl.lightness  = l * 0x101;
    ct.ahsl.pad        = 0;
}